

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_union_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_union_verifier_f *uvf)

{
  uint uVar1;
  uint uVar2;
  flatbuffers_uoffset_t end;
  flatbuffers_uoffset_t offset;
  void *buf;
  int iVar3;
  int iVar4;
  uint *puVar5;
  ushort uVar6;
  uint uVar7;
  flatbuffers_voffset_t id_00;
  ulong uVar8;
  bool bVar9;
  flatbuffers_uoffset_t base;
  flatcc_union_verifier_descriptor_t local_50;
  
  uVar6 = id * 2 + 2;
  if ((td->vsize <= uVar6) || (*(short *)((long)td->vtable + (ulong)uVar6) == 0)) {
    uVar6 = id * 2 + 4;
    if (uVar6 < td->vsize) {
      bVar9 = *(short *)((long)td->vtable + (ulong)uVar6) != 0;
    }
    else {
      bVar9 = false;
    }
    if ((required != 0) && (!bVar9)) {
      return 0x16;
    }
  }
  id_00 = id - 1;
  iVar3 = flatcc_verify_vector_field(td,id_00,required,1,1,0xffffffff);
  if (iVar3 != 0) {
    iVar3 = flatcc_verify_vector_field(td,id_00,required,1,1,0xffffffff);
    return iVar3;
  }
  puVar5 = (uint *)get_field_ptr(td,id_00);
  if (puVar5 == (uint *)0x0) {
    iVar3 = 0;
  }
  else {
    uVar1 = *puVar5;
    uVar2 = *(uint *)((ulong)uVar1 + (long)puVar5);
    iVar3 = get_offset_field(td,id,required,&base);
    if (base != 0 && iVar3 == 0) {
      iVar4 = td->ttl;
      if (iVar4 < 1) {
        iVar3 = 3;
      }
      else {
        buf = td->buf;
        end = td->end;
        offset = *(flatbuffers_uoffset_t *)((long)buf + (ulong)base);
        iVar3 = verify_vector(buf,end,base,offset,4,4,0x3fffffff);
        if (iVar3 == 0) {
          if (*(uint *)((long)buf + (ulong)(offset + base)) == uVar2) {
            local_50.ttl = iVar4 + -1;
            uVar7 = offset + base;
            iVar3 = 0;
            local_50.buf = buf;
            local_50.end = end;
            for (uVar8 = 0; uVar7 = uVar7 + 4, uVar2 != uVar8; uVar8 = uVar8 + 1) {
              local_50.offset = *(flatbuffers_uoffset_t *)((long)buf + (ulong)uVar7);
              local_50.type = *(flatbuffers_utype_t *)((long)puVar5 + uVar8 + (ulong)uVar1 + 4);
              if (local_50.offset == 0) {
                if (local_50.type != '\0') {
                  return 0x20;
                }
              }
              else {
                if (local_50.type == '\0') {
                  return 0x21;
                }
                local_50.base = uVar7;
                iVar4 = (*uvf)(&local_50);
                if (iVar4 != 0) {
                  iVar3 = (*uvf)(&local_50);
                  return iVar3;
                }
              }
            }
          }
          else {
            iVar3 = 0x22;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int flatcc_verify_union_vector_field(flatcc_table_verifier_descriptor_t *td,
    flatbuffers_voffset_t id, int required, flatcc_union_verifier_f uvf)
{
    voffset_t vte_type, vte_table;
    const uoffset_t *buf;
    const utype_t *types;
    uoffset_t count, base;

    if (0 == (vte_type = read_vt_entry(td, id - 1))) {
        if (0 == (vte_table = read_vt_entry(td, id))) {
            verify(!required, flatcc_verify_error_type_field_absent_from_required_union_vector_field);
        }
    }
    check_result(flatcc_verify_vector_field(td, id - 1, required,
                utype_size, utype_size, FLATBUFFERS_COUNT_MAX(utype_size)));
    if (0 == (buf = get_field_ptr(td, id - 1))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    count = read_uoffset(buf, 0);
    ++buf;
    types = (utype_t *)buf;

    check_field(td, id, required, base);
    return verify_union_vector(td->buf, td->end, base, read_uoffset(td->buf, base),
            count, types, td->ttl, uvf);
}